

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinatemenu.cpp
# Opt level: O0

void __thiscall gamespace::CoordinateMenu::invalidate(CoordinateMenu *this)

{
  Renderable *this_00;
  bool bVar1;
  reference ppRVar2;
  Renderable *r;
  iterator __end1;
  iterator __begin1;
  vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_> *__range1;
  CoordinateMenu *this_local;
  
  ui::Renderable::delete_payload(&this->_coordinates->super_Renderable);
  ui::Renderable::delete_payload(&this->_unit_text->super_Renderable);
  ui::Renderable::delete_payload(&this->_hp_text->super_Renderable);
  ui::Renderable::delete_payload(&this->_qt->super_Renderable);
  ui::Renderable::delete_payload(&this->_unit_hp->super_Renderable);
  rebuild_payload(&this->_hp_text->super_Renderable);
  rebuild_payload(&this->_coordinates->super_Renderable);
  rebuild_payload(&this->_unit_text->super_Renderable);
  rebuild_payload(&this->_unit_hp->super_Renderable);
  rebuild_payload(&this->_qt->super_Renderable);
  __end1 = std::vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>::begin
                     (&this->_action_items);
  r = (Renderable *)
      std::vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>::end(&this->_action_items);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ui::Renderable_**,_std::vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>_>
                                *)&r);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<ui::Renderable_**,_std::vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppRVar2;
    ui::Renderable::delete_payload(this_00);
    rebuild_payload(this_00);
    __gnu_cxx::
    __normal_iterator<ui::Renderable_**,_std::vector<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CoordinateMenu::invalidate() {
    _coordinates->delete_payload();
    _unit_text->delete_payload();
    _hp_text->delete_payload();
    _qt->delete_payload();
    _unit_hp->delete_payload();
    rebuild_payload(_hp_text);
    rebuild_payload(_coordinates);
    rebuild_payload(_unit_text);
    rebuild_payload(_unit_hp);
    rebuild_payload(_qt);
    for(auto *r : _action_items) {
        r->delete_payload();
        rebuild_payload(r);
    }
}